

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_match.c
# Opt level: O0

wchar_t set_timefilter_pathname_mbs(archive_match *a,wchar_t timetype,char *path)

{
  int iVar1;
  int *piVar2;
  undefined1 local_b8 [8];
  stat st;
  char *path_local;
  wchar_t timetype_local;
  archive_match *a_local;
  
  st.__glibc_reserved[2] = (__syscall_slong_t)path;
  if ((path == (char *)0x0) || (*path == '\0')) {
    archive_set_error(&a->archive,0x16,"pathname is empty");
    a_local._4_4_ = L'\xffffffe7';
  }
  else {
    iVar1 = stat(path,(stat *)local_b8);
    if (iVar1 == 0) {
      a_local._4_4_ = set_timefilter_stat(a,timetype,(stat *)local_b8);
    }
    else {
      piVar2 = __errno_location();
      archive_set_error(&a->archive,*piVar2,"Failed to stat()");
      a_local._4_4_ = L'\xffffffe7';
    }
  }
  return a_local._4_4_;
}

Assistant:

static int
set_timefilter_pathname_mbs(struct archive_match *a, int timetype,
    const char *path)
{
	struct stat st;

	if (path == NULL || *path == '\0') {
		archive_set_error(&(a->archive), EINVAL, "pathname is empty");
		return (ARCHIVE_FAILED);
	}
	if (la_stat(path, &st) != 0) {
		archive_set_error(&(a->archive), errno, "Failed to stat()");
		return (ARCHIVE_FAILED);
	}
	return (set_timefilter_stat(a, timetype, &st));
}